

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  void *ctx_00;
  uchar *iv_00;
  ulong in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  undefined8 in_RDI;
  uchar *iv;
  uchar *buf;
  size_t j;
  size_t i;
  uchar *out_ptr;
  uchar *in_ptr;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  ulong local_48;
  ulong local_40;
  byte *local_38;
  byte *local_30;
  
  local_40 = 0;
  ctx_00 = (void *)EVP_CIPHER_CTX_buf_noconst(in_RDI);
  iv_00 = (uchar *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
  iVar1 = EVP_CIPHER_CTX_get_num(in_RDI);
  local_38 = in_RSI;
  local_30 = in_RDX;
  if (iVar1 != 0) {
    iVar1 = EVP_CIPHER_CTX_get_num(in_RDI);
    local_40 = 0;
    for (local_48 = (ulong)iVar1; in_stack_ffffffffffffffa7 = local_48 < 8 && local_40 < in_RCX,
        local_48 < 8 && local_40 < in_RCX; local_48 = local_48 + 1) {
      iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
      if (iVar1 == 0) {
        *(byte *)((long)ctx_00 + local_48 + 8) = *local_30;
      }
      *local_38 = *(byte *)((long)ctx_00 + local_48) ^ *local_30;
      iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
      if (iVar1 != 0) {
        *(byte *)((long)ctx_00 + local_48 + 8) = *local_38;
      }
      local_40 = local_40 + 1;
      local_30 = local_30 + 1;
      local_38 = local_38 + 1;
    }
    if (local_48 != 8) {
      EVP_CIPHER_CTX_set_num(in_RDI,local_48 & 0xffffffff);
      return 1;
    }
    *(undefined8 *)iv_00 = *(undefined8 *)((long)ctx_00 + 8);
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  for (; 7 < in_RCX - local_40; local_40 = local_40 + 8) {
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    gost_crypt_mesh(ctx_00,iv_00,
                    (uchar *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (iVar1 == 0) {
      *(undefined8 *)iv_00 = *(undefined8 *)local_30;
    }
    for (local_48 = 0; local_48 < 8; local_48 = local_48 + 1) {
      local_38[local_48] = *(byte *)((long)ctx_00 + local_48) ^ local_30[local_48];
    }
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (iVar1 != 0) {
      *(undefined8 *)iv_00 = *(undefined8 *)local_38;
    }
    local_30 = local_30 + 8;
    local_38 = local_38 + 8;
  }
  if (local_40 < in_RCX) {
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    gost_crypt_mesh(ctx_00,iv_00,
                    (uchar *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (iVar1 == 0) {
      memcpy((void *)((long)ctx_00 + 8),local_30,in_RCX - local_40);
    }
    local_48 = 0;
    for (; local_40 < in_RCX; local_40 = local_40 + 1) {
      local_38[local_48] = *(byte *)((long)ctx_00 + local_48) ^ local_30[local_48];
      local_48 = local_48 + 1;
    }
    EVP_CIPHER_CTX_set_num(in_RDI,local_48 & 0xffffffff);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    if (iVar1 != 0) {
      memcpy((void *)((long)ctx_00 + 8),local_38,local_48);
    }
  }
  else {
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  return 1;
}

Assistant:

static int gost_cipher_do_cfb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                       const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t i = 0;
    size_t j = 0;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
/* process partial block if any */
    if (EVP_CIPHER_CTX_num(ctx)) {
        for (j = EVP_CIPHER_CTX_num(ctx), i = 0; j < 8 && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            if (!EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *in_ptr;
            *out_ptr = buf[j] ^ (*in_ptr);
            if (EVP_CIPHER_CTX_encrypting(ctx))
                buf[j + 8] = *out_ptr;
        }
        if (j == 8) {
            memcpy(iv, buf + 8, 8);
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, j);
            return 1;
        }
    }

    for (; (inl - i) >= 8; i += 8, in_ptr += 8, out_ptr += 8) {
        /*
         * block cipher current iv
         */
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, in_ptr, 8);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        /* Encrypt */
        /* Next iv is next block of cipher text */
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(iv, out_ptr, 8);
    }
/* Process rest of buffer */
    if (i < inl) {
        gost_crypt_mesh(EVP_CIPHER_CTX_get_cipher_data(ctx), iv, buf);
        if (!EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, in_ptr, inl - i);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, j);
        if (EVP_CIPHER_CTX_encrypting(ctx))
            memcpy(buf + 8, out_ptr, j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }
    return 1;
}